

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

DWARFDie __thiscall
llvm::DWARFDie::getAttributeValueAsReferencedDie(DWARFDie *this,DWARFFormValue *V)

{
  DWARFUnitVector *this_00;
  UnitOffset *pUVar1;
  DWARFUnit *this_01;
  uint64_t uVar2;
  DWARFDie DVar3;
  undefined1 local_38 [8];
  Optional<llvm::DWARFFormValue::UnitOffset> SpecRef;
  
  DWARFFormValue::getAsRelativeReference((Optional<llvm::DWARFFormValue::UnitOffset> *)local_38,V);
  if (SpecRef.Storage.field_0.value.Offset._0_1_ == '\x01') {
    pUVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true>::getValue
                       ((OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true> *)local_38);
    if (pUVar1->Unit == (DWARFUnit *)0x0) {
      this_00 = this->U->UnitVector;
      pUVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true> *)local_38);
      this_01 = DWARFUnitVector::getUnitForOffset(this_00,pUVar1->Offset);
      if (this_01 == (DWARFUnit *)0x0) goto LAB_00d9553a;
      pUVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true> *)local_38);
      uVar2 = pUVar1->Offset;
    }
    else {
      pUVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true> *)local_38);
      this_01 = pUVar1->Unit;
      pUVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true> *)local_38);
      uVar2 = (pUVar1->Unit->Header).Offset;
      pUVar1 = optional_detail::OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true>::getValue
                         ((OptionalStorage<llvm::DWARFFormValue::UnitOffset,_true> *)local_38);
      uVar2 = uVar2 + pUVar1->Offset;
    }
    DVar3 = DWARFUnit::getDIEForOffset(this_01,uVar2);
  }
  else {
LAB_00d9553a:
    DVar3 = (DWARFDie)ZEXT816(0);
  }
  return DVar3;
}

Assistant:

DWARFDie
DWARFDie::getAttributeValueAsReferencedDie(const DWARFFormValue &V) const {
  if (auto SpecRef = V.getAsRelativeReference()) {
    if (SpecRef->Unit)
      return SpecRef->Unit->getDIEForOffset(SpecRef->Unit->getOffset() + SpecRef->Offset);
    if (auto SpecUnit = U->getUnitVector().getUnitForOffset(SpecRef->Offset))
      return SpecUnit->getDIEForOffset(SpecRef->Offset);
  }
  return DWARFDie();
}